

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

int __thiscall mpt::array::set(array *this,value *val)

{
  type_t tVar1;
  iovec *piVar2;
  char *pcVar3;
  buffer *ref;
  long lVar4;
  size_t local_80;
  size_t local_78;
  uint local_6c;
  buffer *buf;
  iovec *vec;
  char *base;
  void *ptr;
  size_t sStack_38;
  int type;
  size_t reserve;
  size_t len;
  type_traits *traits;
  value *val_local;
  array *this_local;
  
  len = 0;
  traits = (type_traits *)val;
  val_local = (value *)this;
  tVar1 = value::type(val);
  ptr._4_4_ = (int)tVar1;
  base = (char *)value::data((value *)traits);
  if (ptr._4_4_ == 0x73) {
    base = value::string((value *)traits);
    sStack_38 = 0;
    reserve = 0;
    if (base != (char *)0x0) {
      reserve = strlen(base);
      sStack_38 = reserve + 1;
    }
    len = (size_t)type_traits::get(99);
  }
  else {
    if (ptr._4_4_ != 0x40) {
      if ((ptr._4_4_ < 0x40) || (0x59 < ptr._4_4_)) {
        local_6c = 0;
      }
      else {
        local_6c = ptr._4_4_ + 0x20U & 0xff;
      }
      len = (size_t)type_traits::get(local_6c);
      if ((type_traits *)len == (type_traits *)0x0) {
        pcVar3 = (char *)mpt_data_tostring(&base,(long)ptr._4_4_,&reserve);
        if (pcVar3 == (char *)0x0) {
          len = (size_t)type_traits::get(ptr._4_4_);
          if ((type_traits *)len == (type_traits *)0x0) {
            return -3;
          }
          if (base == (char *)0x0) {
            local_80 = 0;
          }
          else {
            local_80 = ((type_traits *)len)->size;
          }
          reserve = local_80;
          sStack_38 = local_80;
        }
        else {
          if ((reserve == 0) || (pcVar3[reserve - 1] == '\0')) {
            local_78 = reserve;
          }
          else {
            local_78 = reserve + 1;
          }
          sStack_38 = local_78;
          base = pcVar3;
          len = (size_t)type_traits::get(99);
        }
        goto LAB_00140f15;
      }
    }
    piVar2 = value::vector((value *)traits,0);
    if (piVar2 == (iovec *)0x0) {
      base = (char *)0x0;
      reserve = 0;
    }
    else {
      base = (char *)piVar2->iov_base;
      reserve = piVar2->iov_len;
    }
    sStack_38 = reserve;
  }
LAB_00140f15:
  ref = buffer::create(sStack_38,(type_traits *)len);
  if (ref == (buffer *)0x0) {
    this_local._4_4_ = -4;
  }
  else {
    lVar4 = mpt_buffer_set(ref,len,reserve,base,0);
    if ((lVar4 == 0) ||
       ((reserve < sStack_38 && (lVar4 = mpt_buffer_set(ref,len,1,"",reserve), lVar4 == 0)))) {
      (*ref->_vptr_buffer[1])();
      this_local._4_4_ = -4;
    }
    else {
      reference<mpt::array::content>::set_instance(&this->_buf,(content *)ref);
      this_local._4_4_ = ptr._4_4_;
    }
  }
  return this_local._4_4_;
}

Assistant:

int array::set(const value &val)
{
	const type_traits *traits = 0;
	size_t len, reserve;
	const int type = val.type();
	const void *ptr = val.data();
	const char *base = 0;
	
	// string data directly
	if (type == 's') {
		ptr = base = val.string();
		len = reserve = 0;
		if (base) {
			len = strlen(base);
			reserve = len + 1;
		}
		traits = type_traits::get('c');
	}
	// get vector data
	else if (type == TypeVector || (traits = type_traits::get(MPT_type_toScalar(type)))) {
		const struct iovec *vec = val.vector(0);
		if (vec) {
			ptr = vec->iov_base;
			len = vec->iov_len;
		} else {
			ptr = 0;
			len = 0;
		}
		reserve = len;
	}
	// try string extraction
	else if ((base = mpt_data_tostring(&ptr, type, &len))) {
		reserve = len && base[len - 1] ? len + 1 : len;
		ptr = base;
		traits = type_traits::get('c');
	}
	// put scalar entity as single array element
	else if ((traits = type_traits::get(type))) {
		len = ptr ? traits->size : 0;
		reserve = len;
	}
	else {
		return BadType;
	}
	// reserve typed buffer content
	buffer *buf = buffer::create(reserve, traits);
	if (!buf) {
		return BadOperation;
	}
	if (!mpt_buffer_set(buf, traits, len, ptr, 0)
	 || ((reserve > len) && !mpt_buffer_set(buf, traits, 1, "", len))) {
		buf->unref();
		return BadOperation;
	}
	_buf.set_instance(static_cast<content *>(buf));
	return type;
}